

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

LimitToken __thiscall
google::protobuf::internal::EpsCopyInputStream::PushLimit
          (EpsCopyInputStream *this,char *ptr,int limit)

{
  int iVar1;
  void *mem;
  MessageLite *pMVar2;
  uint in_ECX;
  uint uVar3;
  EpsCopyInputStream *this_00;
  
  if (in_ECX < 0x7ffffff0) {
    uVar3 = (limit - (int)*(long *)(ptr + 8)) + in_ECX;
    *(long *)ptr = (long)(int)((int)uVar3 >> 0x1f & uVar3) + *(long *)(ptr + 8);
    iVar1 = *(int *)(ptr + 0x1c);
    *(uint *)(ptr + 0x1c) = uVar3;
    *(uint *)&this->limit_end_ = iVar1 - uVar3;
    return (LimitToken)(int)this;
  }
  this_00 = (EpsCopyInputStream *)&stack0xfffffffffffffff0;
  PushLimit(this_00);
  pMVar2 = (MessageLite *)this_00->limit_end_;
  if ((Arena *)ptr == (Arena *)0x0) {
    mem = operator_new((ulong)*(uint *)this_00->patch_buffer_);
    ptr = (char *)0x0;
  }
  else {
    mem = Arena::Allocate((Arena *)ptr,
                          (ulong)*(uint *)this_00->patch_buffer_ + 7 & 0xfffffffffffffff8);
  }
  pMVar2 = MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
                     ((MessageCreator *)this_00->patch_buffer_,pMVar2,pMVar2,mem,(Arena *)ptr);
  return (LimitToken)(int)pMVar2;
}

Assistant:

PROTOBUF_NODISCARD LimitToken PushLimit(const char* ptr, int limit) {
    ABSL_DCHECK(limit >= 0 && limit <= INT_MAX - kSlopBytes);
    // This add is safe due to the invariant above, because
    // ptr - buffer_end_ <= kSlopBytes.
    limit += static_cast<int>(ptr - buffer_end_);
    limit_end_ = buffer_end_ + (std::min)(0, limit);
    auto old_limit = limit_;
    limit_ = limit;
    return LimitToken(old_limit - limit);
  }